

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

bool __thiscall flatbuffers::Parser::ParseJson(Parser *this,char *json,char *json_filename)

{
  int iVar1;
  undefined1 local_2c [3];
  undefined1 local_29;
  
  iVar1 = this->parse_depth_counter_;
  FlatBufferBuilderImpl<false>::Clear(&this->builder_);
  StartParseFile((Parser *)(local_2c + 2),(char *)this,json);
  local_29 = 1;
  if (local_2c[2] == '\0') {
    DoParseJson((Parser *)local_2c);
    local_2c[1] = 1;
    local_2c[0] = local_2c[0] ^ 1;
  }
  else {
    local_2c[0] = 0;
  }
  if (iVar1 == this->parse_depth_counter_) {
    return (bool)local_2c[0];
  }
  __assert_fail("initial_depth == parse_depth_counter_",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                ,0xd9c,"bool flatbuffers::Parser::ParseJson(const char *, const char *)");
}

Assistant:

bool Parser::ParseJson(const char *json, const char *json_filename) {
  const auto initial_depth = parse_depth_counter_;
  (void)initial_depth;
  builder_.Clear();
  const auto done =
      !StartParseFile(json, json_filename).Check() && !DoParseJson().Check();
  FLATBUFFERS_ASSERT(initial_depth == parse_depth_counter_);
  return done;
}